

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_digraph_algorithm.h
# Opt level: O1

void __thiscall
my_algorithm::WeightedDigraphSPDijkstra<int,_int>::WeightedDigraphSPDijkstra
          (WeightedDigraphSPDijkstra<int,_int> *this,WeightedDigraph<int,_int> *graph,int vertex)

{
  size_t *psVar1;
  int iVar2;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar3;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar4;
  undefined8 *puVar5;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar6;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *pLVar7;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *pLVar8;
  ListNode<data_structures::SymbolTableElement<int,_int>_> *pLVar9;
  out_of_range *poVar10;
  RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
  *pRVar11;
  ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *_current;
  ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  *temp_node;
  SPElement local_50;
  undefined8 *local_48;
  undefined8 *puStack_40;
  undefined8 local_38;
  
  this->_vptr_WeightedDigraphSPDijkstra = (_func_int **)&PTR__WeightedDigraphSPDijkstra_0010da88;
  (this->_edge_to)._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010dab8;
  (this->_edge_to)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010dae8;
  pLVar4 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  pLVar4->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010db18;
  (pLVar4->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010db48;
  pLVar4->_next =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (pLVar4->element).value.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar4->element).value.to =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar4->element).value.weight = 0;
  (this->_edge_to)._list._header = pLVar4;
  (this->_edge_to)._list._tail = pLVar4;
  (this->_edge_to)._list._size = 0;
  local_50 = (SPElement)&PTR__LinkedList_0010dae8;
  puVar5 = (undefined8 *)operator_new(0x38);
  *puVar5 = &PTR__ListNode_0010db18;
  puVar5[2] = &PTR__SymbolTableElement_0010db48;
  puVar5[1] = 0;
  puVar5[4] = 0;
  puVar5[5] = 0;
  *(undefined4 *)(puVar5 + 6) = 0;
  local_38 = 0;
  local_48 = puVar5;
  puStack_40 = puVar5;
  pLVar4 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)operator_new(0x38);
  pLVar4->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010db18;
  (pLVar4->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010db48;
  pLVar4->_next =
       (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
        *)0x0;
  (pLVar4->element).value.from =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar4->element).value.to =
       (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
        *)0x0;
  (pLVar4->element).value.weight = 0;
  (this->_edge_to)._list._header = pLVar4;
  (this->_edge_to)._list._tail = pLVar4;
  (this->_edge_to)._list._size = 0;
  local_50 = (SPElement)&PTR__LinkedList_0010dae8;
  *puVar5 = &PTR__ListNode_0010db18;
  puVar5[1] = 0;
  operator_delete(puVar5,0x38);
  local_38 = 0;
  local_48 = (undefined8 *)0x0;
  puStack_40 = (undefined8 *)0x0;
  (this->_weight_to)._vptr_SymbolTable = (_func_int **)&PTR__SymbolTable_0010db78;
  (this->_weight_to)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010dba8;
  pLVar6 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
  pLVar6->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dbd8;
  (pLVar6->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010dc08;
  pLVar6->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  (this->_weight_to)._list._header = pLVar6;
  (this->_weight_to)._list._tail = pLVar6;
  (this->_weight_to)._list._size = 0;
  local_50 = (SPElement)&PTR__LinkedList_0010dba8;
  puVar5 = (undefined8 *)operator_new(0x20);
  *puVar5 = &PTR__ListNode_0010dbd8;
  puVar5[2] = &PTR__SymbolTableElement_0010dc08;
  puVar5[1] = 0;
  local_38 = 0;
  local_48 = puVar5;
  puStack_40 = puVar5;
  pLVar6 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
  pLVar6->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dbd8;
  (pLVar6->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010dc08;
  pLVar6->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  (this->_weight_to)._list._header = pLVar6;
  (this->_weight_to)._list._tail = pLVar6;
  (this->_weight_to)._list._size = 0;
  local_50 = (SPElement)&PTR__LinkedList_0010dba8;
  *puVar5 = &PTR__ListNode_0010dbd8;
  puVar5[1] = 0;
  operator_delete(puVar5,0x20);
  local_38 = 0;
  local_48 = (undefined8 *)0x0;
  puStack_40 = (undefined8 *)0x0;
  (this->_queue)._vptr_PriorityQueue = (_func_int **)&PTR__PriorityQueue_0010dc38;
  (this->_queue)._list._vptr_LinkedList = (_func_int **)&PTR__LinkedList_0010dc68;
  pLVar7 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
           operator_new(0x18);
  pLVar7->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dc98;
  pLVar7->_next = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0;
  (this->_queue)._list._header = pLVar7;
  (this->_queue)._list._tail = pLVar7;
  (this->_queue)._list._size = 0;
  local_50 = (SPElement)&PTR__LinkedList_0010dc68;
  puVar5 = (undefined8 *)operator_new(0x18);
  *puVar5 = &PTR__ListNode_0010dc98;
  puVar5[1] = 0;
  local_38 = 0;
  local_48 = puVar5;
  puStack_40 = puVar5;
  pLVar7 = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)
           operator_new(0x18);
  pLVar7->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dc98;
  pLVar7->_next = (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0;
  (this->_queue)._list._header = pLVar7;
  (this->_queue)._list._tail = pLVar7;
  (this->_queue)._list._size = 0;
  local_50 = (SPElement)&PTR__LinkedList_0010dc68;
  *puVar5 = &PTR__ListNode_0010dc98;
  puVar5[1] = 0;
  operator_delete(puVar5,0x18);
  local_38 = 0;
  local_48 = (undefined8 *)0x0;
  puStack_40 = (undefined8 *)0x0;
  this->_start = vertex;
  pLVar4 = (this->_edge_to)._list._header;
  if (pLVar4 != (this->_edge_to)._list._tail) {
    do {
      pLVar8 = pLVar4->_next;
      if (pLVar8 != (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                     *)0x0) {
        pLVar4->_next = pLVar8->_next;
        (*pLVar8->_vptr_ListNode[1])(pLVar8);
      }
      if (pLVar8 == (this->_edge_to)._list._tail) {
        (this->_edge_to)._list._tail = pLVar4;
      }
      psVar1 = &(this->_edge_to)._list._size;
      *psVar1 = *psVar1 - 1;
      pLVar4 = (this->_edge_to)._list._header;
    } while (pLVar4 != (this->_edge_to)._list._tail);
  }
  (this->_edge_to)._list._tail = pLVar4;
  (this->_edge_to)._list._size = 0;
  while (pLVar6 = (this->_weight_to)._list._header, pLVar6 != (this->_weight_to)._list._tail) {
    pLVar9 = pLVar6->_next;
    if (pLVar9 != (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      pLVar6->_next = pLVar9->_next;
      (*pLVar9->_vptr_ListNode[1])(pLVar9);
    }
    if (pLVar9 == (this->_weight_to)._list._tail) {
      (this->_weight_to)._list._tail = pLVar6;
    }
    psVar1 = &(this->_weight_to)._list._size;
    *psVar1 = *psVar1 - 1;
  }
  (this->_weight_to)._list._tail = pLVar6;
  (this->_weight_to)._list._size = 0;
  while (pLVar7 = (this->_queue)._list._header, pLVar7 != (this->_queue)._list._tail) {
    pLVar3 = pLVar7->_next;
    if (pLVar3 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
      pLVar7->_next = pLVar3->_next;
      (*pLVar3->_vptr_ListNode[1])(pLVar3);
    }
    if (pLVar3 == (this->_queue)._list._tail) {
      (this->_queue)._list._tail = pLVar7;
    }
    psVar1 = &(this->_queue)._list._size;
    *psVar1 = *psVar1 - 1;
  }
  (this->_queue)._list._tail = pLVar7;
  (this->_queue)._list._size = 0;
  pRVar11 = (graph->super_WeightedGraph<int,_int>)._tree._root;
  while( true ) {
    if (pRVar11 ==
        (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
         *)0x0) {
      poVar10 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(poVar10,"Key error, no such key in this tree !");
      __cxa_throw(poVar10,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    iVar2 = (pRVar11->element).key;
    if (iVar2 == vertex) break;
    pRVar11 = (&pRVar11->_left)[iVar2 <= vertex];
  }
  pLVar4 = (this->_edge_to)._list._header;
  do {
    pLVar4 = pLVar4->_next;
    if (pLVar4 == (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                   *)0x0) {
      pLVar4 = (this->_edge_to)._list._tail;
      pLVar8 = (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
                *)operator_new(0x38);
      pLVar8->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010db18;
      (pLVar8->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010db48;
      (pLVar8->element).value.from =
           (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            *)0x0;
      (pLVar8->element).value.to =
           (RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>
            *)0x0;
      (pLVar8->element).key = vertex;
      (pLVar8->element).value.from = pRVar11;
      (pLVar8->element).value.to = pRVar11;
      (pLVar8->element).value.weight = 0;
      pLVar8->_next =
           (ListNode<data_structures::SymbolTableElement<int,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
            *)0x0;
      pLVar8->_next = pLVar4->_next;
      pLVar4->_next = pLVar8;
      psVar1 = &(this->_edge_to)._list._size;
      *psVar1 = *psVar1 + 1;
      (this->_edge_to)._list._tail = pLVar8;
      goto LAB_0010384e;
    }
  } while ((pLVar4->element).key != vertex);
  (pLVar4->element).value.from = pRVar11;
  (pLVar4->element).value.to = pRVar11;
  (pLVar4->element).value.weight = 0;
LAB_0010384e:
  pLVar6 = (this->_weight_to)._list._header;
  do {
    pLVar6 = pLVar6->_next;
    if (pLVar6 == (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
      pLVar6 = (this->_weight_to)._list._tail;
      pLVar9 = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)operator_new(0x20);
      pLVar9->_vptr_ListNode = (_func_int **)&PTR__ListNode_0010dbd8;
      (pLVar9->element)._vptr_SymbolTableElement = (_func_int **)&PTR__SymbolTableElement_0010dc08;
      (pLVar9->element).key = vertex;
      (pLVar9->element).value = 0;
      pLVar9->_next = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
      pLVar9->_next = pLVar6->_next;
      pLVar6->_next = pLVar9;
      psVar1 = &(this->_weight_to)._list._size;
      *psVar1 = *psVar1 + 1;
      (this->_weight_to)._list._tail = pLVar9;
      goto LAB_001038ad;
    }
  } while ((pLVar6->element).key != vertex);
  (pLVar6->element).value = 0;
LAB_001038ad:
  local_50.weight = 0;
  local_50.vertex = this->_start;
  data_structures::PriorityQueue<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement>::
  enqueue(&this->_queue,&local_50);
  pLVar7 = (this->_queue)._list._header;
  if (pLVar7 != (this->_queue)._list._tail) {
    do {
      if ((this->_queue)._list._size == 0) {
        poVar10 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::out_of_range::out_of_range
                  (poVar10,"N must be larger than 0 and less than this queue\'s size !");
        __cxa_throw(poVar10,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      pLVar3 = pLVar7->_next;
      local_50 = pLVar3->element;
      if (pLVar3 != (ListNode<my_algorithm::WeightedDigraphSPDijkstra<int,_int>::SPElement> *)0x0) {
        pLVar7->_next = pLVar3->_next;
        (*pLVar3->_vptr_ListNode[1])(pLVar3);
      }
      if (pLVar3 == (this->_queue)._list._tail) {
        (this->_queue)._list._tail = pLVar7;
      }
      psVar1 = &(this->_queue)._list._size;
      *psVar1 = *psVar1 - 1;
      _relax(this,graph,&local_50);
      pLVar7 = (this->_queue)._list._header;
    } while (pLVar7 != (this->_queue)._list._tail);
  }
  return;
}

Assistant:

WeightedDigraphSPDijkstra(WeightedDigraph<T, Weight> &graph, T vertex) {
            _start = vertex;
            _edge_to.clear();
            _weight_to.clear();
            _queue.clear();
            auto start = graph.getNode(vertex);
            _edge_to.set(vertex, Edge(start, start, Weight()));
            _weight_to.set(vertex, Weight());
            _queue.enqueue(SPElement(_start, Weight()));
            while (!_queue.isEmpty()) {
                _relax(graph, _queue.dequeueMinN(1));
            }
        }